

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O0

Id dxil_spv::emit_native_bitscan(GLSLstd450 opcode,Impl *impl,Instruction *instruction,Value *value)

{
  Id this [2];
  Id IVar1;
  uint uVar2;
  Op op_00;
  Id IVar3;
  Id IVar4;
  Id arg;
  uint32_t lit;
  Builder *this_00;
  Type *pTVar5;
  Operation *pOVar6;
  Operation *this_01;
  GLSLstd450 merge_op;
  Operation *or32;
  Operation *ext_1;
  Id local_88;
  int i;
  Id scalars [2];
  Operation *ilsb;
  Operation *xored;
  Id elems [2];
  Operation *shifted;
  Id int_type;
  Operation *ext;
  Operation *bitcast;
  Id uvec2_type;
  Id uint_type;
  Operation *extend;
  Operation *op;
  Builder *builder;
  Value *value_local;
  Instruction *instruction_local;
  Impl *impl_local;
  GLSLstd450 opcode_local;
  
  this_00 = Converter::Impl::builder(impl);
  if (impl->glsl_std450_ext == 0) {
    IVar1 = spv::Builder::import(this_00,"GLSL.std.450");
    impl->glsl_std450_ext = IVar1;
  }
  pTVar5 = LLVMBC::Value::getType(value);
  uVar2 = LLVMBC::Type::getIntegerBitWidth(pTVar5);
  if (uVar2 == 0x10) {
    op_00 = OpUConvert;
    if (opcode == GLSLstd450FindSMsb) {
      op_00 = OpSConvert;
    }
    IVar1 = spv::Builder::makeUintType(this_00,0x20);
    pOVar6 = Converter::Impl::allocate(impl,op_00,IVar1);
    IVar1 = Converter::Impl::get_id_for_value(impl,value,0);
    Operation::add_id(pOVar6,IVar1);
    Converter::Impl::add(impl,pOVar6,false);
    if (instruction == (Instruction *)0x0) {
      IVar1 = spv::Builder::makeUintType(this_00,0x20);
      extend = Converter::Impl::allocate(impl,OpExtInst,IVar1);
    }
    else {
      extend = Converter::Impl::allocate(impl,OpExtInst,&instruction->super_Value);
    }
    Operation::add_id(extend,impl->glsl_std450_ext);
    Operation::add_literal(extend,opcode);
    Operation::add_id(extend,pOVar6->id);
  }
  else {
    pTVar5 = LLVMBC::Value::getType(value);
    uVar2 = LLVMBC::Type::getIntegerBitWidth(pTVar5);
    if (uVar2 == 0x40) {
      IVar1 = spv::Builder::makeUintType(this_00,0x20);
      IVar3 = spv::Builder::makeVectorType(this_00,IVar1,2);
      pOVar6 = Converter::Impl::allocate(impl,OpBitcast,IVar3);
      IVar4 = Converter::Impl::get_id_for_value(impl,value,0);
      Operation::add_id(pOVar6,IVar4);
      Converter::Impl::add(impl,pOVar6,false);
      ext = pOVar6;
      impl_local._4_4_ = opcode;
      if (opcode == GLSLstd450FindSMsb) {
        this_01 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar1);
        Operation::add_id(this_01,pOVar6->id);
        Operation::add_literal(this_01,1);
        Converter::Impl::add(impl,this_01,false);
        IVar4 = spv::Builder::makeIntType(this_00,0x20);
        elems = (Id  [2])Converter::Impl::allocate(impl,OpShiftRightArithmetic,IVar4);
        Operation::add_id((Operation *)elems,this_01->id);
        this = elems;
        arg = spv::Builder::makeIntConstant(this_00,0x1f,false);
        Operation::add_id((Operation *)this,arg);
        Converter::Impl::add(impl,(Operation *)elems,false);
        xored._0_4_ = *(undefined4 *)((long)elems + 4);
        xored._4_4_ = *(undefined4 *)((long)elems + 4);
        ext = Converter::Impl::allocate(impl,OpBitwiseXor,IVar3);
        Operation::add_id(ext,pOVar6->id);
        IVar4 = Converter::Impl::build_vector(impl,IVar4,(Id *)&xored,2);
        Operation::add_id(ext,IVar4);
        Converter::Impl::add(impl,ext,false);
        impl_local._4_4_ = GLSLstd450FindUMsb;
      }
      scalars = (Id  [2])Converter::Impl::allocate(impl,OpExtInst,IVar3);
      Operation::add_id((Operation *)scalars,impl->glsl_std450_ext);
      Operation::add_literal((Operation *)scalars,impl_local._4_4_);
      Operation::add_id((Operation *)scalars,ext->id);
      Converter::Impl::add(impl,(Operation *)scalars,false);
      for (ext_1._4_4_ = 0; (int)ext_1._4_4_ < 2; ext_1._4_4_ = ext_1._4_4_ + 1) {
        pOVar6 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar1);
        Operation::add_id(pOVar6,*(Id *)((long)scalars + 4));
        Operation::add_literal(pOVar6,ext_1._4_4_);
        Converter::Impl::add(impl,pOVar6,false);
        (&local_88)[(int)ext_1._4_4_] = pOVar6->id;
      }
      pOVar6 = Converter::Impl::allocate(impl,OpBitwiseOr,IVar1);
      Operation::add_id(pOVar6,i);
      IVar3 = spv::Builder::makeUintConstant(this_00,0x20,false);
      Operation::add_id(pOVar6,IVar3);
      Converter::Impl::add(impl,pOVar6,false);
      i = pOVar6->id;
      lit = 0x2a;
      if (impl_local._4_4_ == GLSLstd450FindILsb) {
        lit = 0x26;
      }
      if (instruction == (Instruction *)0x0) {
        extend = Converter::Impl::allocate(impl,OpExtInst,IVar1);
      }
      else {
        extend = Converter::Impl::allocate(impl,OpExtInst,&instruction->super_Value);
      }
      Operation::add_id(extend,impl->glsl_std450_ext);
      Operation::add_literal(extend,lit);
      Operation::add_id(extend,local_88);
      Operation::add_id(extend,i);
    }
    else {
      if (instruction == (Instruction *)0x0) {
        IVar1 = spv::Builder::makeUintType(this_00,0x20);
        extend = Converter::Impl::allocate(impl,OpExtInst,IVar1);
      }
      else {
        extend = Converter::Impl::allocate(impl,OpExtInst,&instruction->super_Value);
      }
      Operation::add_id(extend,impl->glsl_std450_ext);
      Operation::add_literal(extend,opcode);
      IVar1 = Converter::Impl::get_id_for_value(impl,value,0);
      Operation::add_id(extend,IVar1);
    }
  }
  Converter::Impl::add(impl,extend,false);
  return extend->id;
}

Assistant:

spv::Id emit_native_bitscan(GLSLstd450 opcode, Converter::Impl &impl,
                            const llvm::Instruction *instruction, const llvm::Value *value)
{
	auto &builder = impl.builder();
	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	Operation *op;

	// Vulkan currently does not allow 16/64-bit for these ... :(
	if (value->getType()->getIntegerBitWidth() == 16)
	{
		auto *extend = impl.allocate(
		    opcode == GLSLstd450FindSMsb ? spv::OpSConvert : spv::OpUConvert, builder.makeUintType(32));

		extend->add_id(impl.get_id_for_value(value));
		impl.add(extend);

		if (instruction)
			op = impl.allocate(spv::OpExtInst, instruction);
		else
			op = impl.allocate(spv::OpExtInst, builder.makeUintType(32));

		op->add_id(impl.glsl_std450_ext);
		op->add_literal(opcode);
		op->add_id(extend->id);
	}
	else if (value->getType()->getIntegerBitWidth() == 64)
	{
		spv::Id uint_type = builder.makeUintType(32);
		spv::Id uvec2_type = builder.makeVectorType(uint_type, 2);

		auto *bitcast = impl.allocate(spv::OpBitcast, uvec2_type);
		bitcast->add_id(impl.get_id_for_value(value));
		impl.add(bitcast);

		if (opcode == GLSLstd450FindSMsb)
		{
			auto *ext = impl.allocate(spv::OpCompositeExtract, uint_type);
			ext->add_id(bitcast->id);
			ext->add_literal(1);
			impl.add(ext);

			spv::Id int_type = builder.makeIntType(32);
			auto *shifted = impl.allocate(spv::OpShiftRightArithmetic, int_type);
			shifted->add_id(ext->id);
			shifted->add_id(builder.makeIntConstant(31));
			impl.add(shifted);

			const spv::Id elems[] = { shifted->id, shifted->id };

			auto *xored = impl.allocate(spv::OpBitwiseXor, uvec2_type);
			xored->add_id(bitcast->id);
			xored->add_id(impl.build_vector(int_type, elems, 2));
			impl.add(xored);

			bitcast = xored;
			opcode = GLSLstd450FindUMsb;
		}

		auto *ilsb = impl.allocate(spv::OpExtInst, uvec2_type);
		ilsb->add_id(impl.glsl_std450_ext);
		ilsb->add_literal(opcode);
		ilsb->add_id(bitcast->id);
		impl.add(ilsb);

		spv::Id scalars[2];
		for (int i = 0; i < 2; i++)
		{
			auto *ext = impl.allocate(spv::OpCompositeExtract, uint_type);
			ext->add_id(ilsb->id);
			ext->add_literal(i);
			impl.add(ext);
			scalars[i] = ext->id;
		}

		auto *or32 = impl.allocate(spv::OpBitwiseOr, uint_type);
		or32->add_id(scalars[1]);
		or32->add_id(builder.makeUintConstant(32));
		impl.add(or32);
		scalars[1] = or32->id;

		auto merge_op = opcode == GLSLstd450FindILsb ? GLSLstd450UMin : GLSLstd450SMax;

		if (instruction)
			op = impl.allocate(spv::OpExtInst, instruction);
		else
			op = impl.allocate(spv::OpExtInst, uint_type);

		op->add_id(impl.glsl_std450_ext);
		op->add_literal(merge_op);
		op->add_id(scalars[0]);
		op->add_id(scalars[1]);
	}
	else
	{
		if (instruction)
			op = impl.allocate(spv::OpExtInst, instruction);
		else
			op = impl.allocate(spv::OpExtInst, builder.makeUintType(32));

		op->add_id(impl.glsl_std450_ext);
		op->add_literal(opcode);
		op->add_id(impl.get_id_for_value(value));
	}

	impl.add(op);
	return op->id;
}